

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O0

uint64_t __thiscall icu_63::double_conversion::Double::DiyFpToUint64(Double *this,DiyFp diy_fp)

{
  long local_38;
  uint64_t biased_exponent;
  ulong uStack_28;
  int exponent;
  uint64_t significand;
  DiyFp diy_fp_local;
  
  diy_fp_local.f_._0_4_ = (undefined4)diy_fp.f_;
  significand = (uint64_t)this;
  uStack_28 = DiyFp::f((DiyFp *)&significand);
  biased_exponent._4_4_ = DiyFp::e((DiyFp *)&significand);
  for (; 0x1fffffffffffff < uStack_28; uStack_28 = uStack_28 >> 1) {
    biased_exponent._4_4_ = biased_exponent._4_4_ + 1;
  }
  if (biased_exponent._4_4_ < 0x3cc) {
    if (biased_exponent._4_4_ < -0x432) {
      diy_fp_local.e_ = 0;
      diy_fp_local._12_4_ = 0;
    }
    else {
      for (; -0x432 < biased_exponent._4_4_ && (uStack_28 & 0x10000000000000) == 0;
          biased_exponent._4_4_ = biased_exponent._4_4_ + -1) {
        uStack_28 = uStack_28 << 1;
      }
      if ((biased_exponent._4_4_ == -0x432) && ((uStack_28 & 0x10000000000000) == 0)) {
        local_38 = 0;
      }
      else {
        local_38 = (long)(biased_exponent._4_4_ + 0x433);
      }
      diy_fp_local._8_8_ = uStack_28 & 0xfffffffffffff | local_38 << 0x34;
    }
  }
  else {
    diy_fp_local.e_ = 0;
    diy_fp_local._12_4_ = 0x7ff00000;
  }
  return diy_fp_local._8_8_;
}

Assistant:

static uint64_t DiyFpToUint64(DiyFp diy_fp) {
    uint64_t significand = diy_fp.f();
    int exponent = diy_fp.e();
    while (significand > kHiddenBit + kSignificandMask) {
      significand >>= 1;
      exponent++;
    }
    if (exponent >= kMaxExponent) {
      return kInfinity;
    }
    if (exponent < kDenormalExponent) {
      return 0;
    }
    while (exponent > kDenormalExponent && (significand & kHiddenBit) == 0) {
      significand <<= 1;
      exponent--;
    }
    uint64_t biased_exponent;
    if (exponent == kDenormalExponent && (significand & kHiddenBit) == 0) {
      biased_exponent = 0;
    } else {
      biased_exponent = static_cast<uint64_t>(exponent + kExponentBias);
    }
    return (significand & kSignificandMask) |
        (biased_exponent << kPhysicalSignificandSize);
  }